

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall icu_63::VArray::~VArray(VArray *this)

{
  long lVar1;
  
  if ((this->deleter != (Fn_Deleter)0x0) && (0 < this->size)) {
    lVar1 = 0;
    do {
      (*this->deleter)(this->buf[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->size);
  }
  uprv_free_63(this->buf);
  return;
}

Assistant:

~VArray() {
        if (deleter) {
            for (int i = 0; i < size; ++i) {
                (*deleter)(buf[i]);
            }
        }
        uprv_free(buf); 
    }